

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rewind-window.cc
# Opt level: O2

void __thiscall Debugger::RewindWindow::Tick(RewindWindow *this)

{
  Emulator *e;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  f32 *pfVar3;
  ImVec2 *pIVar4;
  Debugger *this_00;
  size_t this_01;
  bool bVar5;
  bool bVar6;
  Bool BVar7;
  Ticks TVar8;
  Ticks TVar9;
  Ticks TVar10;
  long lVar11;
  ImDrawList *this_02;
  size_t size;
  size_t size_00;
  size_t size_01;
  size_t size_02;
  size_t size_03;
  size_t size_04;
  size_t size_05;
  size_t size_06;
  size_t size_07;
  size_t size_08;
  size_t size_09;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  Debugger *pDVar16;
  ImVec2 IVar17;
  ImVec2 IVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  JoypadStats JVar26;
  bool rewinding;
  anon_class_24_3_8a65b60c xoffset;
  float local_158;
  float fStack_154;
  anon_class_40_5_a302e0d8 draw_bar;
  float local_118;
  f32 h;
  f32 w;
  ImDrawList *draw_list;
  Ticks local_e0;
  Ticks local_d8;
  Debugger *local_d0;
  Debugger *local_c8;
  size_t capacity;
  ImVec2 local_b8;
  ImVec2 br_pos;
  ImVec2 ul_pos;
  RewindStats rw_stats;
  ImVec2 local_38;
  
  if ((this->super_Window).is_open == true) {
    bVar5 = ImGui::Begin("Rewind",&(this->super_Window).is_open,0);
    if (bVar5) {
      BVar7 = host_is_rewinding(((this->super_Window).d)->host);
      rewinding = BVar7 != FALSE;
      bVar5 = ImGui::Checkbox("Rewind",&rewinding);
      if (bVar5) {
        pDVar16 = (this->super_Window).d;
        if (rewinding == true) {
          BeginRewind(pDVar16);
        }
        else {
          EndRewind(pDVar16);
        }
      }
      if (rewinding == true) {
        TVar8 = emulator_get_ticks(((this->super_Window).d)->e);
        TVar9 = host_get_rewind_oldest_ticks(((this->super_Window).d)->host);
        uVar14 = TVar8 - TVar9;
        TVar10 = host_newest_ticks(((this->super_Window).d)->host);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = TVar10 - TVar9;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar14;
        draw_bar.ul_pos =
             (ImVec2 *)CONCAT44(draw_bar.ul_pos._4_4_,SUB164(auVar2 / ZEXT816(0x11250),0));
        ImGui::PushButtonRepeat(true);
        rw_stats.base_bytes = 0;
        bVar5 = ImGui::Button("-1",(ImVec2 *)&rw_stats);
        if (bVar5) {
          draw_bar.ul_pos = (ImVec2 *)CONCAT44(draw_bar.ul_pos._4_4_,(int)draw_bar.ul_pos + -1);
        }
        ImGui::SameLine(0.0,-1.0);
        rw_stats.base_bytes = 0;
        bVar5 = ImGui::Button("+1",(ImVec2 *)&rw_stats);
        if (bVar5) {
          draw_bar.ul_pos = (ImVec2 *)CONCAT44(draw_bar.ul_pos._4_4_,(int)draw_bar.ul_pos + 1);
        }
        ImGui::PopButtonRepeat();
        ImGui::SameLine(0.0,-1.0);
        iVar15 = SUB164(auVar1 / ZEXT816(0x11250),0);
        ImGui::SliderInt("Frames",(int *)&draw_bar,0,iVar15,"%d",0);
        iVar12 = 0;
        if (0 < (int)draw_bar.ul_pos) {
          iVar12 = (int)draw_bar.ul_pos;
        }
        if (iVar15 <= iVar12) {
          iVar12 = iVar15;
        }
        draw_bar.ul_pos = (ImVec2 *)CONCAT44(draw_bar.ul_pos._4_4_,iVar12);
        xoffset.w = (f32 *)CONCAT44(xoffset.w._4_4_,(int)(uVar14 % 0x11250));
        ImGui::PushButtonRepeat(true);
        rw_stats.base_bytes = 0;
        bVar5 = ImGui::Button("-I",(ImVec2 *)&rw_stats);
        if (bVar5) {
          xoffset.w = (f32 *)CONCAT44(xoffset.w._4_4_,(int)xoffset.w + -0x1c);
        }
        ImGui::SameLine(0.0,-1.0);
        rw_stats.base_bytes = 0;
        bVar6 = ImGui::Button("+I",(ImVec2 *)&rw_stats);
        if (bVar6) {
          xoffset.w = (f32 *)CONCAT44(xoffset.w._4_4_,(int)xoffset.w + 1);
        }
        ImGui::PopButtonRepeat();
        ImGui::SameLine(0.0,-1.0);
        ImGui::SliderInt("Tick Offset",(int *)&xoffset,0,0x1124f,"%d",0);
        uVar13 = (long)(int)xoffset.w + (long)(int)draw_bar.ul_pos * 0x11250;
        if (uVar14 != uVar13) {
          RewindTo((this->super_Window).d,uVar13 + TVar9);
          if (bVar5) {
            iVar12 = -1;
            emulator_write_state(((this->super_Window).d)->e,&this->reverse_step_save_state);
            while( true ) {
              TVar9 = emulator_get_ticks(((this->super_Window).d)->e);
              e = ((this->super_Window).d)->e;
              if (TVar8 <= TVar9) break;
              emulator_step(e);
              iVar12 = iVar12 + 1;
            }
            emulator_read_state(e,&this->reverse_step_save_state);
            iVar15 = 0;
            if (0 < iVar12) {
              iVar15 = iVar12;
            }
            while (bVar5 = iVar15 != 0, iVar15 = iVar15 + -1, bVar5) {
              emulator_step(((this->super_Window).d)->e);
            }
          }
        }
      }
      ImGui::Separator();
      JVar26 = host_get_joypad_stats(((this->super_Window).d)->host);
      host_get_rewind_stats(&rw_stats,((this->super_Window).d)->host);
      this_01 = rw_stats.base_bytes;
      local_d0 = (Debugger *)rw_stats.used_bytes;
      local_c8 = (Debugger *)rw_stats.capacity_bytes;
      capacity = rw_stats.capacity_bytes;
      local_d8 = host_newest_ticks(((this->super_Window).d)->host);
      local_e0 = host_oldest_ticks(((this->super_Window).d)->host);
      PrettySize_abi_cxx11_((string *)&draw_bar,(Debugger *)JVar26.used_bytes,size);
      pIVar4 = draw_bar.ul_pos;
      PrettySize_abi_cxx11_((string *)&xoffset,(Debugger *)JVar26.capacity_bytes,size_00);
      ImGui::Text("joypad used/capacity: %s/%s",pIVar4,xoffset.w);
      std::__cxx11::string::~string((string *)&xoffset);
      std::__cxx11::string::~string((string *)&draw_bar);
      PrettySize_abi_cxx11_((string *)&draw_bar,(Debugger *)this_01,size_01);
      pIVar4 = draw_bar.ul_pos;
      PrettySize_abi_cxx11_((string *)&xoffset,(Debugger *)rw_stats.diff_bytes,size_02);
      pfVar3 = xoffset.w;
      pDVar16 = (Debugger *)(rw_stats.diff_bytes + this_01);
      PrettySize_abi_cxx11_((string *)&draw_list,pDVar16,size_03);
      auVar19._8_4_ = (int)((ulong)pDVar16 >> 0x20);
      auVar19._0_8_ = pDVar16;
      auVar19._12_4_ = 0x45300000;
      dVar21 = (auVar19._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)pDVar16) - 4503599627370496.0);
      auVar22._8_4_ = (int)(rw_stats.uncompressed_bytes >> 0x20);
      auVar22._0_8_ = rw_stats.uncompressed_bytes;
      auVar22._12_4_ = 0x45300000;
      ImGui::Text("rewind base/diff/total: %s/%s/%s (%.0f%%)",
                  (dVar21 * 100.0) /
                  ((auVar22._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)rw_stats.uncompressed_bytes) -
                  4503599627370496.0)),pIVar4,pfVar3,draw_list);
      std::__cxx11::string::~string((string *)&draw_list);
      std::__cxx11::string::~string((string *)&xoffset);
      std::__cxx11::string::~string((string *)&draw_bar);
      PrettySize_abi_cxx11_((string *)&draw_bar,(Debugger *)rw_stats.uncompressed_bytes,size_04);
      ImGui::Text("rewind uncomp: %s",draw_bar.ul_pos);
      this_00 = local_c8;
      pDVar16 = local_d0;
      std::__cxx11::string::~string((string *)&draw_bar);
      PrettySize_abi_cxx11_((string *)&draw_bar,pDVar16,size_05);
      pIVar4 = draw_bar.ul_pos;
      PrettySize_abi_cxx11_((string *)&xoffset,this_00,size_06);
      auVar23._8_4_ = (int)((ulong)pDVar16 >> 0x20);
      auVar23._0_8_ = pDVar16;
      auVar23._12_4_ = 0x45300000;
      auVar24._8_4_ = (int)((ulong)this_00 >> 0x20);
      auVar24._0_8_ = this_00;
      auVar24._12_4_ = 0x45300000;
      ImGui::Text("rewind used: %s/%s (%.0f%%)",
                  (((auVar23._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)pDVar16) - 4503599627370496.0)) * 100.0) /
                  ((auVar24._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)this_00) - 4503599627370496.0)),pIVar4,xoffset.w
                 );
      lVar11 = local_d8 - local_e0;
      auVar20._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar20._0_8_ = lVar11;
      auVar20._12_4_ = 0x45300000;
      std::__cxx11::string::~string((string *)&xoffset);
      std::__cxx11::string::~string((string *)&draw_bar);
      dVar21 = dVar21 / (((auVar20._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) *
                        2.384185791015625e-07);
      PrettySize_abi_cxx11_
                ((string *)&draw_bar,
                 (Debugger *)
                 ((long)(dVar21 - 9.223372036854776e+18) & (long)dVar21 >> 0x3f | (long)dVar21),
                 size_07);
      pIVar4 = draw_bar.ul_pos;
      dVar21 = dVar21 * 60.0;
      PrettySize_abi_cxx11_
                ((string *)&xoffset,
                 (Debugger *)
                 ((long)(dVar21 - 9.223372036854776e+18) & (long)dVar21 >> 0x3f | (long)dVar21),
                 size_08);
      pfVar3 = xoffset.w;
      uVar14 = (ulong)(dVar21 * 60.0);
      PrettySize_abi_cxx11_
                ((string *)&draw_list,
                 (Debugger *)
                 ((long)(dVar21 * 60.0 - 9.223372036854776e+18) & (long)uVar14 >> 0x3f | uVar14),
                 size_09);
      ImGui::Text("rate: %s/sec %s/min %s/hr",pIVar4,pfVar3,draw_list);
      std::__cxx11::string::~string((string *)&draw_list);
      std::__cxx11::string::~string((string *)&xoffset);
      std::__cxx11::string::~string((string *)&draw_bar);
      TVar8 = host_get_rewind_oldest_ticks(((this->super_Window).d)->host);
      TVar9 = host_get_rewind_newest_ticks(((this->super_Window).d)->host);
      lVar11 = TVar9 - TVar8;
      auVar25._8_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar25._0_8_ = lVar11;
      auVar25._12_4_ = 0x45300000;
      ImGui::Text("range: [%lu..%lu] (%.0f sec)",
                  ((auVar25._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar11) - 4503599627370496.0)) *
                  2.384185791015625e-07,TVar8,TVar9);
      IVar17 = ImGui::GetCursorScreenPos();
      IVar18 = ImGui::GetContentRegionAvail();
      this_02 = ImGui::GetWindowDrawList();
      local_118 = IVar18.x;
      w = (f32)local_118;
      h = 64.0;
      local_158 = IVar17.x;
      fStack_154 = IVar17.y;
      ul_pos.x = local_158;
      ul_pos.y = fStack_154;
      br_pos.x = local_118 + local_158;
      br_pos.y = fStack_154 + 64.0;
      local_b8.x = 4.0;
      local_b8.y = 4.0;
      draw_list = this_02;
      ImDrawList::AddRectFilled(this_02,&ul_pos,&br_pos,0xff000000,0.0,0);
      draw_bar.ul_pos = (ImVec2 *)CONCAT44(ul_pos.y + 4.0,ul_pos.x + 4.0);
      xoffset.w = (f32 *)CONCAT44(br_pos.y + -4.0,br_pos.x + -4.0);
      ImDrawList::AddRectFilled(this_02,(ImVec2 *)&draw_bar,(ImVec2 *)&xoffset,0xffffffff,0.0,0);
      xoffset.w = &w;
      xoffset.capacity = &capacity;
      draw_bar.h = &h;
      draw_bar.draw_list = &draw_list;
      xoffset.margin = &local_b8;
      draw_bar.ul_pos = &ul_pos;
      draw_bar.margin = &local_b8;
      draw_bar.xoffset = &xoffset;
      Tick::anon_class_40_5_a302e0d8::operator()
                (&draw_bar,rw_stats.data_ranges[0],rw_stats.data_ranges[1],0xfff38bff);
      Tick::anon_class_40_5_a302e0d8::operator()
                (&draw_bar,rw_stats.data_ranges[2],rw_stats.data_ranges[3],0xffac5eb5);
      Tick::anon_class_40_5_a302e0d8::operator()
                (&draw_bar,rw_stats.info_ranges[0],rw_stats.info_ranges[1],0xff64ea54);
      Tick::anon_class_40_5_a302e0d8::operator()
                (&draw_bar,rw_stats.info_ranges[2],rw_stats.info_ranges[3],0xff3eab32);
      local_38.x = (float)w;
      local_38.y = (float)h;
      ImGui::Dummy(&local_38);
    }
    ImGui::End();
  }
  return;
}

Assistant:

void Debugger::RewindWindow::Tick() {
  if (!is_open) return;

  if (ImGui::Begin(Debugger::s_rewind_window_name, &is_open)) {
    bool rewinding = host_is_rewinding(d->host);
    if (ImGui::Checkbox("Rewind", &rewinding)) {
      if (rewinding) {
        d->BeginRewind();
      } else {
        d->EndRewind();
      }
    }

    if (rewinding) {
      Ticks cur_cy = emulator_get_ticks(d->e);
      Ticks oldest_cy = host_get_rewind_oldest_ticks(d->host);
      Ticks rel_cur_cy = cur_cy - oldest_cy;
      u32 range_fr = (host_newest_ticks(d->host) - oldest_cy) / PPU_FRAME_TICKS;

      // Frames.
      int frame = rel_cur_cy / PPU_FRAME_TICKS;

      ImGui::PushButtonRepeat(true);
      if (ImGui::Button("-1")) {
        --frame;
      }
      ImGui::SameLine();
      if (ImGui::Button("+1")) {
        ++frame;
      }
      ImGui::PopButtonRepeat();
      ImGui::SameLine();
      ImGui::SliderInt("Frames", &frame, 0, range_fr);

      frame = CLAMP(frame, 0, static_cast<int>(range_fr));

      // Ticks.
      int offset_cy = rel_cur_cy % PPU_FRAME_TICKS;
      bool reverse_step = false;

      ImGui::PushButtonRepeat(true);
      if (ImGui::Button("-I")) {
        offset_cy -= 28;
        reverse_step = true;
      }
      ImGui::SameLine();
      if (ImGui::Button("+I")) {
        offset_cy += 1;
      }
      ImGui::PopButtonRepeat();
      ImGui::SameLine();
      ImGui::SliderInt("Tick Offset", &offset_cy, 0, PPU_FRAME_TICKS - 1);

      Ticks rel_seek_cy = (Ticks)frame * PPU_FRAME_TICKS + offset_cy;

      if (rel_cur_cy != rel_seek_cy) {
        d->RewindTo(oldest_cy + rel_seek_cy);

        // Reverse stepping is tricky because we don't know how long the
        // previous instruction took. We can rewind by 28 ticks (longer than
        // any instruction or interrupt dispatch) and step forward until just
        // before the current tick. But since we don't know how long a step
        // will take, it's easier to just save state, step forward one
        // instruction too far, then load state and step just before it.
        if (reverse_step) {
          emulator_write_state(d->e, &reverse_step_save_state);
          int count = 0;
          for (; emulator_get_ticks(d->e) < cur_cy; ++count) {
            emulator_step(d->e);
          }

          emulator_read_state(d->e, &reverse_step_save_state);
          for (int i = 0; i < count - 1; ++i) {
            emulator_step(d->e);
          }
        }
      }
    }

    ImGui::Separator();
    JoypadStats joyp_stats = host_get_joypad_stats(d->host);
    RewindStats rw_stats = host_get_rewind_stats(d->host);
    size_t base = rw_stats.base_bytes;
    size_t diff = rw_stats.diff_bytes;
    size_t total = base + diff;
    size_t uncompressed = rw_stats.uncompressed_bytes;
    size_t used = rw_stats.used_bytes;
    size_t capacity = rw_stats.capacity_bytes;
    Ticks total_ticks = host_newest_ticks(d->host) - host_oldest_ticks(d->host);
    f64 sec = (f64)total_ticks / CPU_TICKS_PER_SECOND;

    ImGui::Text("joypad used/capacity: %s/%s",
                d->PrettySize(joyp_stats.used_bytes).c_str(),
                d->PrettySize(joyp_stats.capacity_bytes).c_str());

    ImGui::Text("rewind base/diff/total: %s/%s/%s (%.0f%%)",
                d->PrettySize(base).c_str(), d->PrettySize(diff).c_str(),
                d->PrettySize(total).c_str(), (f64)(total)*100 / uncompressed);
    ImGui::Text("rewind uncomp: %s", d->PrettySize(uncompressed).c_str());
    ImGui::Text("rewind used: %s/%s (%.0f%%)", d->PrettySize(used).c_str(),
                d->PrettySize(capacity).c_str(), (f64)used * 100 / capacity);
    ImGui::Text("rate: %s/sec %s/min %s/hr", d->PrettySize(total / sec).c_str(),
                d->PrettySize(total / sec * 60).c_str(),
                d->PrettySize(total / sec * 60 * 60).c_str());

    Ticks oldest = host_get_rewind_oldest_ticks(d->host);
    Ticks newest = host_get_rewind_newest_ticks(d->host);
    f64 range = (f64)(newest - oldest) / CPU_TICKS_PER_SECOND;
    ImGui::Text("range: [%" PRIu64 "..%" PRIu64 "] (%.0f sec)", oldest, newest,
                range);

    ImVec2 cursor = ImGui::GetCursorScreenPos();
    ImVec2 avail_size = ImGui::GetContentRegionAvail();
    ImDrawList* draw_list = ImGui::GetWindowDrawList();

    f32 w = avail_size.x, h = 64;
    ImVec2 ul_pos = cursor;
    ImVec2 br_pos = ul_pos + ImVec2(w, h);
    ImVec2 margin(4, 4);
    draw_list->AddRectFilled(ul_pos, br_pos, IM_COL32_BLACK);
    draw_list->AddRectFilled(ul_pos + margin, br_pos - margin, IM_COL32_WHITE);

    auto xoffset = [&](size_t x) -> f32 {
      return (f32)x * (w - margin.x * 2) / (f32)capacity;
    };

    auto draw_bar = [&](size_t l, size_t r, ImU32 col) {
      ImVec2 ul = ul_pos + margin + ImVec2(xoffset(l), 0);
      ImVec2 br = ul_pos + margin + ImVec2(xoffset(r), h - margin.y * 2);
      draw_list->AddRectFilled(ul, br, col);
    };

    draw_bar(rw_stats.data_ranges[0], rw_stats.data_ranges[1], 0xfff38bff);
    draw_bar(rw_stats.data_ranges[2], rw_stats.data_ranges[3], 0xffac5eb5);
    draw_bar(rw_stats.info_ranges[0], rw_stats.info_ranges[1], 0xff64ea54);
    draw_bar(rw_stats.info_ranges[2], rw_stats.info_ranges[3], 0xff3eab32);
    ImGui::Dummy(ImVec2(w, h));
  }
  ImGui::End();
}